

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawMsg.h
# Opt level: O3

RawMsg * __thiscall SocketPP::RawMsg::operator=(RawMsg *this,RawMsg *msg)

{
  ulong __n;
  byte *__src;
  byte *__dest;
  
  if (msg != this) {
    if (this->data_ != (byte *)0x0) {
      operator_delete__(this->data_);
    }
    __n = msg->len_;
    __src = msg->data_;
    if (__src == (byte *)0x0 || __n == 0) {
      this->len_ = 0;
      this->data_ = (byte *)0x0;
    }
    else {
      this->len_ = __n;
      __dest = (byte *)operator_new__(__n);
      this->data_ = __dest;
      memcpy(__dest,__src,__n);
    }
  }
  return this;
}

Assistant:

RawMsg& operator=(const RawMsg& msg) {
        if (&msg == this)
            return *this;

        delete[] data_;
        initMsg(msg.data_, msg.len_);
        return *this;
    }